

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall trompeloeil::trace_agent::trace_exception(trace_agent *this)

{
  long *plVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 auVar4 [12];
  
  if (this->t == (tracer *)0x0) {
    return;
  }
  auVar4 = __cxa_rethrow();
  plVar1 = (long *)__cxa_begin_catch(auVar4._0_8_);
  if (auVar4._8_4_ == 2) {
    poVar2 = std::operator<<((ostream *)&this->os,"threw exception: what() = ");
    pcVar3 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,'\n');
  }
  else {
    std::operator<<((ostream *)&this->os,"threw unknown exception\n");
  }
  __cxa_end_catch();
  return;
}

Assistant:

void
    trace_exception()
    {
      if (t)
      {
        try {
          throw;
        }
        catch (std::exception& e)
        {
          os << "threw exception: what() = " << e.what() << '\n';
        }
        catch (...)
        {
          os << "threw unknown exception\n";
        }
      }
    }